

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * exprItem(void)

{
  pattern *rhs_00;
  pattern *rhs;
  pattern *lhs;
  
  rhs = setItem();
  while (lookahead == 0x7c) {
    matchTok(0x7c);
    rhs_00 = setItem();
    rhs = makeNode(rhs,rhs_00,300);
  }
  return rhs;
}

Assistant:

pattern* exprItem() {
   pattern *lhs, *rhs;
   
   lhs = setItem();
   for (;;) {
      if (lookahead == '|') {
	 matchTok('|');
	 rhs = setItem();
	 lhs = makeNode(lhs, rhs, OR_NODE);
      }
      else {
	 break;
      }
   }
   return lhs;
}